

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

bool DirUtils::IsSameDir(string *p1,string *p2)

{
  __type _Var1;
  string local_58 [8];
  string s2;
  string local_38 [8];
  string s1;
  string *p2_local;
  string *p1_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  AbsPath(p1,(string *)local_38);
  AbsPath(p2,(string *)local_58);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return _Var1;
}

Assistant:

bool DirUtils::IsSameDir(const string& p1, const string& p2){
	string s1, s2;
	AbsPath(p1, s1);
	AbsPath(p2, s2);
	return s1 == s2;
}